

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_10bbd57::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  _Link_type __k;
  size_t *psVar1;
  pointer *ppSVar2;
  pointer *ppCVar3;
  uint uVar4;
  UInt value;
  cmMakefile *pcVar5;
  pointer pcVar6;
  pointer __first;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  cmGeneratorTarget *headTarget;
  _Base_ptr p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Base_ptr p_Var11;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar12;
  ValueHolder *pVVar13;
  ValueHolder *pVVar14;
  pointer pSVar15;
  undefined1 auVar16 [16];
  ValueHolder VVar17;
  ValueHolder *pVVar18;
  bool bVar19;
  TargetType TVar20;
  int iVar21;
  ArrayIndex AVar22;
  string *psVar23;
  Value *pVVar24;
  char *pcVar25;
  cmLocalGenerator *pcVar26;
  string *psVar27;
  cmInstallTargetGenerator *this_00;
  cmGlobalGenerator *pcVar28;
  OutputInfo *pOVar29;
  undefined8 *puVar30;
  Value *pVVar31;
  size_t sVar32;
  TargetDependSet *pTVar33;
  _Base_ptr p_Var34;
  iterator iVar35;
  _Rb_tree_node_base *this_01;
  _Base_ptr p_Var36;
  byte extraout_var;
  pointer __result;
  pointer pIVar37;
  pointer pIVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  KindedSources *pKVar40;
  __node_base_ptr p_Var41;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var42;
  pointer pSVar43;
  ValueHolder VVar44;
  long lVar45;
  ulong uVar46;
  ValueHolder VVar47;
  pointer pCVar48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *language;
  _Tp_alloc_type *p_Var49;
  string *path_00;
  string *path_01;
  ulong uVar50;
  SourceGroup *__args;
  SourceGroup *extraout_RDX;
  SourceGroup *__args_00;
  long *plVar51;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  _Rb_tree_header *p_Var52;
  ValueHolder VVar53;
  ValueHolder VVar54;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__v;
  undefined8 frag;
  pointer pSVar55;
  undefined8 uVar56;
  _Link_type __p;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *p_Var57;
  ValueHolder VVar58;
  __node_base_ptr p_Var59;
  long lVar60;
  _Rb_tree_node_base *p_Var61;
  pointer pSVar62;
  pointer pCVar63;
  iterator iVar64;
  pointer pSVar65;
  ulong uVar66;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar67;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar68;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value,_unsigned_int>_>,_bool> pVar69;
  string obj_dir;
  size_type __dnew;
  Value artifact;
  string p;
  Value artifacts;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> installGens;
  string path;
  __string_type __str;
  string COMPILE_DEFINITIONS;
  Value compileDataJson;
  string defPropName;
  Value dependencies;
  ValueHolder local_698;
  undefined1 auStack_690 [16];
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_680;
  _Base_ptr local_678;
  undefined8 local_670;
  Value *local_660;
  ValueHolder local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  _Base_ptr local_638;
  undefined8 local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_628;
  _Base_ptr local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  ValueHolder local_5f8;
  long local_5f0;
  undefined1 local_5e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  undefined8 local_5c8;
  string *psStack_5c0;
  string *local_5b8;
  undefined8 uStack_5b0;
  ValueHolder local_5a8;
  ValueHolder VStack_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  ValueHolder local_588;
  undefined1 local_580 [8];
  undefined1 local_578 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  ValueHolder local_520 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  ValueHolder local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Base_ptr local_4d0;
  ValueHolder local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  ValueHolder local_4a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  ValueHolder local_480;
  char *local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Base_ptr local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ValueHolder local_430;
  pointer local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  string local_408;
  _Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
  *local_3e8;
  _Base_ptr local_3e0;
  _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_3d8;
  _Base_ptr local_3d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  *local_3c8;
  _Base_ptr local_3c0;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_3b8;
  string *local_3b0;
  _Alloc_node local_3a8;
  Value local_3a0;
  Value local_378;
  Value local_350;
  Value local_328;
  Value local_300;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_660 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  TVar20 = cmGeneratorTarget::GetType(this->GT);
  p_Var34 = (_Base_ptr)(ulong)TVar20;
  psVar23 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&local_d0,psVar23);
  pVVar24 = Json::Value::operator[](local_660,"name");
  Json::Value::operator=(pVVar24,&local_d0);
  Json::Value::~Value(&local_d0);
  pcVar25 = cmState::GetTargetTypeName(TVar20);
  Json::Value::Value(&local_f8,pcVar25);
  pVVar24 = Json::Value::operator[](local_660,"type");
  Json::Value::operator=(pVVar24,&local_f8);
  Json::Value::~Value(&local_f8);
  psVar23 = &this->TopBuild;
  TargetId((string *)&local_618,this->GT,psVar23);
  Json::Value::Value(&local_120,(string *)&local_618);
  pVVar24 = Json::Value::operator[](local_660,"id");
  Json::Value::operator=(pVVar24,&local_120);
  Json::Value::~Value(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_allocated_capacity != &local_608) {
    operator_delete((void *)local_618._M_allocated_capacity,
                    CONCAT17(local_608._M_local_buf[7],
                             CONCAT16(local_608._M_local_buf[6],
                                      CONCAT15(local_608._M_local_buf[5],
                                               CONCAT14(local_608._M_local_buf[4],
                                                        local_608._M_allocated_capacity._0_4_)))) +
                    1);
  }
  Json::Value::Value(&local_2d8,objectValue);
  pcVar26 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar27 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar26);
  local_3b0 = &this->TopSource;
  RelativeIfUnder((string *)&local_588,local_3b0,psVar27);
  Json::Value::Value((Value *)&local_618,(string *)&local_588);
  pVVar24 = Json::Value::operator[](&local_2d8,"source");
  Json::Value::operator=(pVVar24,(Value *)&local_618);
  Json::Value::~Value((Value *)&local_618);
  if (local_588 != (cmSourceGroup *)(local_580 + 8)) {
    operator_delete(local_588.string_,CONCAT35(local_578._5_3_,local_578._0_5_) + 1);
  }
  psVar27 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar26);
  RelativeIfUnder((string *)&local_698,psVar23,psVar27);
  Json::Value::Value((Value *)&local_588,(string *)&local_698);
  pVVar24 = Json::Value::operator[](&local_2d8,"build");
  Json::Value::operator=(pVVar24,(Value *)&local_588);
  Json::Value::~Value((Value *)&local_588);
  if (local_698 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(auStack_690 + 8)) {
    operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
  }
  pVVar24 = Json::Value::operator[](local_660,"paths");
  Json::Value::operator=(pVVar24,&local_2d8);
  Json::Value::~Value(&local_2d8);
  bVar19 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar19) {
    Json::Value::Value(&local_148,true);
    pVVar24 = Json::Value::operator[](local_660,"isGeneratorProvided");
    Json::Value::operator=(pVVar24,&local_148);
    Json::Value::~Value(&local_148);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&local_618);
  AddBacktrace(this,local_660,(cmListFileBacktrace *)&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
  }
  bVar19 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar19) {
    Json::Value::Value(&local_300,objectValue);
    Json::Value::Value((Value *)&local_698,objectValue);
    pcVar5 = this->GT->Makefile;
    local_658.int_ = 0x14;
    local_618._M_allocated_capacity = (size_type)&local_608;
    local_618._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_618._M_allocated_capacity,(ulong)&local_658);
    local_608._M_allocated_capacity._0_4_ = (undefined4)local_658.int_;
    local_608._M_local_buf[4] = (char)((ulong)local_658 >> 0x20);
    local_608._M_local_buf[5] = (char)((ulong)local_658 >> 0x28);
    local_608._M_local_buf[6] = (char)((ulong)local_658 >> 0x30);
    local_608._M_local_buf[7] = (char)((ulong)local_658 >> 0x38);
    *(undefined8 *)local_618._M_allocated_capacity = 0x4e495f454b414d43;
    builtin_strncpy((char *)(local_618._M_allocated_capacity + 8),"STALL_PR",8);
    *(undefined4 *)(local_618._M_allocated_capacity + 0x10) = 0x58494645;
    local_618._8_8_ = local_658;
    *(local_618._M_allocated_capacity + local_658.string_) = '\0';
    psVar27 = cmMakefile::GetSafeDefinition(pcVar5,(string *)&local_618);
    local_588 = (ValueHolder)((long)local_580 + 8);
    pcVar6 = (psVar27->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_588,pcVar6,pcVar6 + psVar27->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_allocated_capacity != &local_608) {
      operator_delete((void *)local_618._M_allocated_capacity,
                      CONCAT17(local_608._M_local_buf[7],
                               CONCAT16(local_608._M_local_buf[6],
                                        CONCAT15(local_608._M_local_buf[5],
                                                 CONCAT14(local_608._M_local_buf[4],
                                                          local_608._M_allocated_capacity._0_4_))))
                      + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_588);
    Json::Value::Value((Value *)&local_618,(string *)&local_588);
    pVVar24 = Json::Value::operator[]((Value *)&local_698,"path");
    Json::Value::operator=(pVVar24,(Value *)&local_618);
    Json::Value::~Value((Value *)&local_618);
    if (local_588 != (cmSourceGroup *)(local_580 + 8)) {
      operator_delete(local_588.string_,CONCAT35(local_578._5_3_,local_578._0_5_) + 1);
    }
    pVVar24 = Json::Value::operator[](&local_300,"prefix");
    Json::Value::operator=(pVVar24,(Value *)&local_698);
    Json::Value::~Value((Value *)&local_698);
    Json::Value::Value((Value *)&local_658,arrayValue);
    local_620 = p_Var34;
    std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
              ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)&local_4c8,
               &this->GT->Makefile->InstallGenerators);
    if (local_4c8 != local_4c0) {
      VVar53 = local_4c8;
      do {
        if (*(size_type *)VVar53.string_ == 0) {
          this_00 = (cmInstallTargetGenerator *)0x0;
        }
        else {
          this_00 = (cmInstallTargetGenerator *)
                    __dynamic_cast(*(size_type *)VVar53.string_,&cmInstallGenerator::typeinfo,
                                   &cmInstallTargetGenerator::typeinfo);
        }
        if ((this_00 != (cmInstallTargetGenerator *)0x0) && (this_00->Target == this->GT)) {
          Json::Value::Value((Value *)&local_588,objectValue);
          cmInstallTargetGenerator::GetDestination((string *)local_520,this_00,this->Config);
          Json::Value::Value((Value *)&local_618,(string *)local_520);
          pVVar24 = Json::Value::operator[]((Value *)&local_588,"path");
          Json::Value::operator=(pVVar24,(Value *)&local_618);
          Json::Value::~Value((Value *)&local_618);
          if (local_520[0] != &local_510) {
            operator_delete(local_520[0].string_,local_510._M_allocated_capacity + 1);
          }
          AddBacktrace(this,(Value *)&local_588,&this_00->Backtrace);
          Json::Value::append((Value *)&local_658,(Value *)&local_588);
          Json::Value::~Value((Value *)&local_588);
        }
        VVar53.string_ = (char *)((long)&(VVar53.map_)->_M_t + 8);
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)VVar53.int_ != local_4c0);
    }
    if (local_4c8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_4c8.string_,local_4b8._M_allocated_capacity - (long)local_4c8);
    }
    pVVar24 = Json::Value::operator[](&local_300,"destinations");
    p_Var34 = local_620;
    Json::Value::operator=(pVVar24,(Value *)&local_658);
    Json::Value::~Value((Value *)&local_658);
    pVVar24 = Json::Value::operator[](local_660,"install");
    Json::Value::operator=(pVVar24,&local_300);
    Json::Value::~Value(&local_300);
  }
  bVar19 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar19) {
    Json::Value::Value((Value *)local_520,arrayValue);
    TVar20 = cmGeneratorTarget::GetType(this->GT);
    if (TVar20 == OBJECT_LIBRARY) {
      pcVar28 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
      iVar21 = (*pcVar28->_vptr_cmGlobalGenerator[0x25])(pcVar28,0);
      if ((char)iVar21 != '\0') {
        local_4f8.int_ = 0;
        paStack_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_4e8._M_allocated_capacity._0_5_ = 0;
        local_4e8._M_allocated_capacity._5_3_ = 0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &local_4f8,this->Config);
        local_620 = p_Var34;
        cmGeneratorTarget::GetObjectDirectory((string *)&local_698,this->GT,this->Config);
        paVar39 = paStack_4f0;
        if (local_4f8 != paStack_4f0) {
          VVar53 = local_4f8;
          do {
            psVar27 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar53.string_);
            Json::Value::Value((Value *)&local_618,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_698,psVar27);
            RelativeIfUnder((string *)&local_658,psVar23,(string *)&local_4c8);
            Json::Value::Value((Value *)&local_588,(string *)&local_658);
            pVVar24 = Json::Value::operator[]((Value *)&local_618,"path");
            Json::Value::operator=(pVVar24,(Value *)&local_588);
            Json::Value::~Value((Value *)&local_588);
            if (local_658 != &local_648) {
              operator_delete(local_658.string_,local_648._M_allocated_capacity + 1);
            }
            if (local_4c8 != &local_4b8) {
              operator_delete(local_4c8.string_,local_4b8._M_allocated_capacity + 1);
            }
            Json::Value::append((Value *)local_520,(Value *)&local_618);
            Json::Value::~Value((Value *)&local_618);
            VVar53.string_ = (char *)((long)&(VVar53.map_)->_M_t + 8);
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)VVar53.int_ != paVar39);
        }
        p_Var34 = local_620;
        if (local_698 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_690 + 8)) {
          operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
        }
        if (local_4f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_4f8.string_,
                          CONCAT35(local_4e8._M_allocated_capacity._5_3_,
                                   local_4e8._M_allocated_capacity._0_5_) - (long)local_4f8);
        }
      }
    }
    else {
      Json::Value::Value((Value *)&local_618,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&local_658,this->GT,this->Config,RuntimeBinaryArtifact,false);
      RelativeIfUnder((string *)&local_698,psVar23,(string *)&local_658);
      Json::Value::Value((Value *)&local_588,(string *)&local_698);
      pVVar24 = Json::Value::operator[]((Value *)&local_618,"path");
      Json::Value::operator=(pVVar24,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
      if (local_698 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_690 + 8)) {
        operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
      }
      if (local_658 != &local_648) {
        operator_delete(local_658.string_,local_648._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)local_520,(Value *)&local_618);
      Json::Value::~Value((Value *)&local_618);
      bVar19 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((bVar19) && (TVar20 = cmGeneratorTarget::GetType(this->GT), TVar20 != STATIC_LIBRARY)) {
        TVar20 = cmGeneratorTarget::GetType(this->GT);
        if ((TVar20 == SHARED_LIBRARY) ||
           (bVar19 = cmGeneratorTarget::IsExecutableWithExports(this->GT), bVar19)) {
          Json::Value::Value((Value *)&local_618,objectValue);
          cmGeneratorTarget::GetFullPath
                    ((string *)&local_4c8,this->GT,this->Config,ImportLibraryArtifact,false);
          RelativeIfUnder((string *)&local_658,psVar23,(string *)&local_4c8);
          Json::Value::Value((Value *)&local_698,(string *)&local_658);
          pVVar24 = Json::Value::operator[]((Value *)&local_618,"path");
          Json::Value::operator=(pVVar24,(Value *)&local_698);
          Json::Value::~Value((Value *)&local_698);
          if (local_658 != &local_648) {
            operator_delete(local_658.string_,local_648._M_allocated_capacity + 1);
          }
          if (local_4c8 != &local_4b8) {
            operator_delete(local_4c8.string_,local_4b8._M_allocated_capacity + 1);
          }
          Json::Value::append((Value *)local_520,(Value *)&local_618);
          Json::Value::~Value((Value *)&local_618);
        }
        pOVar29 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config);
        if ((pOVar29 != (OutputInfo *)0x0) && ((pOVar29->PdbDir)._M_string_length != 0)) {
          Json::Value::Value((Value *)&local_618,objectValue);
          pcVar6 = (pOVar29->PdbDir)._M_dataplus._M_p;
          local_480.string_ = (char *)&local_470;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_480,pcVar6,pcVar6 + (pOVar29->PdbDir)._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_480,(ulong)local_478,0,'\x01');
          cmGeneratorTarget::GetPDBName((string *)&local_430,this->GT,this->Config);
          pcVar25 = (char *)0xf;
          if (local_480 != &local_470) {
            pcVar25 = (char *)CONCAT17(local_470._M_local_buf[7],
                                       local_470._M_allocated_capacity._0_7_);
          }
          if (pcVar25 < (char *)((long)local_428 + (long)local_478)) {
            uVar56 = (char *)0xf;
            if (local_430 != &local_420) {
              uVar56 = local_420._M_allocated_capacity;
            }
            if ((ulong)uVar56 < (char *)((long)local_428 + (long)local_478)) goto LAB_003249be;
            puVar30 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,local_480.uint_)
            ;
          }
          else {
LAB_003249be:
            puVar30 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_480.int_,local_430.uint_);
          }
          local_4f8.string_ = (char *)&local_4e8;
          paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar30 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar30 == paVar39) {
            uVar56 = puVar30[3];
            local_4e8._M_allocated_capacity._0_5_ = (undefined5)paVar39->_M_allocated_capacity;
            local_4e8._M_allocated_capacity._5_3_ =
                 (undefined3)(paVar39->_M_allocated_capacity >> 0x28);
            local_4e8._8_5_ = (undefined5)uVar56;
            local_4e8._M_local_buf[0xd] = (char)((ulong)uVar56 >> 0x28);
            local_4e8._14_2_ = (undefined2)((ulong)uVar56 >> 0x30);
          }
          else {
            local_4e8._M_allocated_capacity._0_5_ = (undefined5)paVar39->_M_allocated_capacity;
            local_4e8._M_allocated_capacity._5_3_ =
                 (undefined3)(paVar39->_M_allocated_capacity >> 0x28);
            local_4f8.string_ = ((char *)*puVar30).string_;
          }
          paStack_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar30[1];
          *puVar30 = paVar39;
          puVar30[1] = 0;
          paVar39->_M_local_buf[0] = '\0';
          RelativeIfUnder((string *)&local_4c8,psVar23,(string *)&local_4f8);
          Json::Value::Value((Value *)&local_658,(string *)&local_4c8);
          pVVar24 = Json::Value::operator[]((Value *)&local_618,"path");
          Json::Value::operator=(pVVar24,(Value *)&local_658);
          Json::Value::~Value((Value *)&local_658);
          if (local_4c8 != &local_4b8) {
            operator_delete(local_4c8.string_,local_4b8._M_allocated_capacity + 1);
          }
          if (local_4f8 != &local_4e8) {
            operator_delete(local_4f8.string_,
                            CONCAT35(local_4e8._M_allocated_capacity._5_3_,
                                     local_4e8._M_allocated_capacity._0_5_) + 1);
          }
          if (local_430 != &local_420) {
            operator_delete(local_430.string_,local_420._M_allocated_capacity + 1);
          }
          if (local_480 != &local_470) {
            operator_delete(local_480.string_,
                            CONCAT17(local_470._M_local_buf[7],local_470._M_allocated_capacity._0_7_
                                    ) + 1);
          }
          Json::Value::append((Value *)local_520,(Value *)&local_618);
          Json::Value::~Value((Value *)&local_618);
        }
      }
    }
    bVar19 = Json::Value::empty((Value *)local_520);
    if (!bVar19) {
      Json::Value::Value(&local_170,(Value *)local_520);
      pVVar24 = Json::Value::operator[](local_660,"artifacts");
      Json::Value::operator=(pVVar24,&local_170);
      Json::Value::~Value(&local_170);
    }
    Json::Value::~Value((Value *)local_520);
  }
  iVar21 = (int)p_Var34;
  if (iVar21 - 2U < 2) {
LAB_00324bb7:
    cmGeneratorTarget::GetFullName((string *)&local_618,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&local_198,(string *)&local_618);
    pVVar24 = Json::Value::operator[](local_660,"nameOnDisk");
    Json::Value::operator=(pVVar24,&local_198);
    Json::Value::~Value(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_allocated_capacity != &local_608) {
      operator_delete((void *)local_618._M_allocated_capacity,
                      CONCAT17(local_608._M_local_buf[7],
                               CONCAT16(local_608._M_local_buf[6],
                                        CONCAT15(local_608._M_local_buf[5],
                                                 CONCAT14(local_608._M_local_buf[4],
                                                          local_608._M_allocated_capacity._0_4_))))
                      + 1);
    }
    Json::Value::Value(&local_378,objectValue);
    cmGeneratorTarget::GetLinkerLanguage((string *)local_520,this->GT,this->Config);
    Json::Value::Value((Value *)&local_618,(string *)local_520);
    pVVar24 = &local_378;
    pVVar31 = Json::Value::operator[](pVVar24,"language");
    Json::Value::operator=(pVVar31,(Value *)&local_618);
    Json::Value::~Value((Value *)&local_618);
    DumpLinkCommandFragments((Value *)&local_588,this);
    bVar19 = Json::Value::empty((Value *)&local_588);
    if (!bVar19) {
      Json::Value::Value((Value *)&local_698,(Value *)&local_588);
      pVVar31 = Json::Value::operator[](&local_378,"commandFragments");
      Json::Value::operator=(pVVar31,(Value *)&local_698);
      Json::Value::~Value((Value *)&local_698);
    }
    Json::Value::~Value((Value *)&local_588);
    pcVar5 = this->GT->Makefile;
    local_588 = (ValueHolder)((long)local_580 + 8);
    local_658.int_ = 0x12;
    local_588.int_ = std::__cxx11::string::_M_create(&local_588.uint_,(ulong)&local_658);
    local_578._0_5_ = (undefined5)local_658.int_;
    local_578._5_3_ = (undefined3)((ulong)local_658 >> 0x28);
    builtin_strncpy((char *)local_588,"CMAKE_SY",8);
    *(undefined8 *)&((local_588.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x494c5f544f4f5253;
    *(undefined2 *)&((local_588.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         0x4b4e;
    local_580 = (undefined1  [8])local_658;
    local_588.string_[local_658.string_] = '\0';
    pcVar25 = cmMakefile::GetDefinition(pcVar5,(string *)&local_588);
    if (local_588 != (cmSourceGroup *)(local_580 + 8)) {
      operator_delete(local_588.string_,CONCAT35(local_578._5_3_,local_578._0_5_) + 1);
    }
    if (pcVar25 == (char *)0x0) {
      local_578._0_5_ = 0x454b414d43;
      local_578._5_3_ = 0x59535f;
      local_578._8_5_ = 0x544f4f5253;
      local_580 = (undefined1  [8])0xd;
      local_578[0xd] = 0;
      local_588 = (ValueHolder)((long)local_580 + 8U);
      pcVar25 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_588);
      if (local_588.int_ != (long)local_580 + 8U) {
        operator_delete(local_588.string_,CONCAT35(local_578._5_3_,local_578._0_5_) + 1);
      }
      if (pcVar25 != (char *)0x0) {
        local_658.string_ = (char *)&local_648;
        sVar32 = strlen(pcVar25);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_658,pcVar25,pcVar25 + sVar32);
        DumpSysroot((Value *)&local_588,(Target *)&local_658,path_01);
        pVVar31 = Json::Value::operator[](&local_378,"sysroot");
        Json::Value::operator=(pVVar31,(Value *)&local_588);
        goto LAB_00324ed1;
      }
    }
    else {
      local_658.string_ = (char *)&local_648;
      sVar32 = strlen(pcVar25);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,pcVar25,pcVar25 + sVar32)
      ;
      DumpSysroot((Value *)&local_588,(Target *)&local_658,path_00);
      pVVar31 = Json::Value::operator[](&local_378,"sysroot");
      Json::Value::operator=(pVVar31,(Value *)&local_588);
LAB_00324ed1:
      Json::Value::~Value((Value *)&local_588);
      if (local_658 != &local_648) {
        operator_delete(local_658.string_,local_648._M_allocated_capacity + 1);
      }
    }
    bVar19 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)local_520,this->Config);
    if (bVar19) {
      Json::Value::Value((Value *)&local_658,true);
      pVVar31 = Json::Value::operator[](&local_378,"lto");
      Json::Value::operator=(pVVar31,(Value *)&local_658);
      Json::Value::~Value((Value *)&local_658);
    }
    if (local_520[0] != &local_510) {
      operator_delete(local_520[0].string_,local_510._M_allocated_capacity + 1);
    }
    pVVar31 = Json::Value::operator[](local_660,"link");
    Json::Value::operator=(pVVar31,pVVar24);
  }
  else {
    if (iVar21 != 1) {
      if (iVar21 != 0) goto LAB_0032514e;
      goto LAB_00324bb7;
    }
    cmGeneratorTarget::GetFullName((string *)&local_618,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&local_1c0,(string *)&local_618);
    pVVar24 = Json::Value::operator[](local_660,"nameOnDisk");
    Json::Value::operator=(pVVar24,&local_1c0);
    Json::Value::~Value(&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_allocated_capacity != &local_608) {
      operator_delete((void *)local_618._M_allocated_capacity,
                      CONCAT17(local_608._M_local_buf[7],
                               CONCAT16(local_608._M_local_buf[6],
                                        CONCAT15(local_608._M_local_buf[5],
                                                 CONCAT14(local_608._M_local_buf[4],
                                                          local_608._M_allocated_capacity._0_4_))))
                      + 1);
    }
    pVVar24 = &local_288;
    Json::Value::Value(pVVar24,objectValue);
    DumpLinkCommandFragments((Value *)&local_618,this);
    bVar19 = Json::Value::empty((Value *)&local_618);
    if (!bVar19) {
      Json::Value::Value((Value *)&local_588,(Value *)&local_618);
      pVVar31 = Json::Value::operator[](&local_288,"commandFragments");
      Json::Value::operator=(pVVar31,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
    }
    Json::Value::~Value((Value *)&local_618);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_698,this->GT,this->Config);
    bVar19 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_698,this->Config);
    if (bVar19) {
      Json::Value::Value((Value *)&local_618,true);
      pVVar31 = Json::Value::operator[](&local_288,"lto");
      Json::Value::operator=(pVVar31,(Value *)&local_618);
      Json::Value::~Value((Value *)&local_618);
    }
    if (local_698 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_690 + 8)) {
      operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
    }
    pVVar31 = Json::Value::operator[](local_660,"archive");
    Json::Value::operator=(pVVar31,pVVar24);
  }
  Json::Value::~Value(pVVar24);
LAB_0032514e:
  Json::Value::Value(&local_328,arrayValue);
  pcVar28 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar33 = cmGlobalGenerator::GetTargetDirectDepends(pcVar28,this->GT);
  p_Var34 = (pTVar33->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var52 = &(pTVar33->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var34 != p_Var52) {
    do {
      Json::Value::Value((Value *)&local_588,objectValue);
      TargetId((string *)&local_698,*(cmGeneratorTarget **)(p_Var34 + 1),psVar23);
      Json::Value::Value((Value *)&local_618,(string *)&local_698);
      pVVar24 = Json::Value::operator[]((Value *)&local_588,"id");
      Json::Value::operator=(pVVar24,(Value *)&local_618);
      Json::Value::~Value((Value *)&local_618);
      if (local_698 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_690 + 8)) {
        operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
      }
      AddBacktrace(this,(Value *)&local_588,(cmListFileBacktrace *)&p_Var34[1]._M_left);
      Json::Value::append(&local_328,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
      p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
    } while ((_Rb_tree_header *)p_Var34 != p_Var52);
  }
  bVar19 = Json::Value::empty(&local_328);
  if (!bVar19) {
    Json::Value::Value(&local_1e8,&local_328);
    pVVar24 = Json::Value::operator[](local_660,"dependencies");
    Json::Value::operator=(pVVar24,&local_1e8);
    Json::Value::~Value(&local_1e8);
  }
  local_580 = (undefined1  [8])((ulong)local_580 & 0xffffffff00000000);
  local_578._0_5_ = 0;
  local_578._5_3_ = 0;
  local_578._8_5_ =
       SUB85((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_580,0);
  local_578[0xd] = (undefined1)((ulong)local_580 >> 0x28);
  local_578._14_2_ = (undefined2)((ulong)local_580 >> 0x30);
  local_578._24_8_ = 0;
  local_578._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_580;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_588,this->Config);
  paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT26(local_578._14_2_,CONCAT15(local_578[0xd],local_578._8_5_));
  if (paVar39 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580) {
    local_458 = (_Base_ptr)&this->CompileDataMap;
    local_4d0 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      p_Var36 = local_4d0;
      local_620 = (_Base_ptr)(&paVar39->_M_allocated_capacity + 4);
      iVar35 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                              *)local_458,(key_type *)local_620);
      if ((iVar35._M_node == p_Var36) ||
         (iVar21 = std::__cxx11::string::compare((string *)local_620), iVar21 < 0)) {
        this_01 = (_Rb_tree_node_base *)operator_new(200);
        __k = (_Link_type)(this_01 + 1);
        *(_Base_ptr **)(this_01 + 1) = &this_01[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,(&paVar39->_M_allocated_capacity)[4],
                   (&paVar39->_M_allocated_capacity)[5] + (&paVar39->_M_allocated_capacity)[4]);
        memset(this_01 + 2,0,0x88);
        *(_Base_ptr **)(this_01 + 2) = &this_01[2]._M_left;
        this_01[2]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&this_01[2]._M_left = 0;
        *(_Base_ptr **)(this_01 + 3) = &this_01[3]._M_left;
        this_01[3]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&this_01[3]._M_left = 0;
        *(undefined8 *)(this_01 + 4) = 0;
        this_01[4]._M_parent = (_Base_ptr)0x0;
        this_01[4]._M_left = (_Base_ptr)0x0;
        this_01[4]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_01 + 5) = 0;
        this_01[5]._M_parent = (_Base_ptr)0x0;
        this_01[5]._M_left = (_Base_ptr)0x0;
        this_01[5]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_01 + 6) = 0;
        if (iVar35._M_node == local_4d0) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar21 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar21)) {
LAB_003254b8:
            __p = __k;
            pVar67 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                 *)local_458,(key_type *)__k);
          }
          else {
            p_Var36 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_003254d0:
            auVar16._8_8_ = 0;
            auVar16._0_8_ = p_Var36;
            pVar67 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar16 << 0x40);
          }
        }
        else {
          __p = (_Link_type)(iVar35._M_node + 1);
          iVar21 = std::__cxx11::string::compare((string *)__k);
          if (iVar21 < 0) {
            p_Var36 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar67.second = p_Var36;
            pVar67.first = p_Var36;
            if (p_Var36 != iVar35._M_node) {
              p_Var36 = (_Base_ptr)std::_Rb_tree_decrement(iVar35._M_node);
              __p = __k;
              iVar21 = std::__cxx11::string::compare((string *)(p_Var36 + 1));
              if (-1 < iVar21) goto LAB_003254b8;
              iVar64 = iVar35;
              if (p_Var36->_M_right == (_Base_ptr)0x0) {
                iVar35._M_node = p_Var36;
                iVar64._M_node = (_Base_ptr)0x0;
              }
LAB_003254e4:
              pVar67.second = iVar35._M_node;
              pVar67.first = iVar64._M_node;
            }
          }
          else {
            __p = __k;
            iVar21 = std::__cxx11::string::compare((string *)(iVar35._M_node + 1));
            if (iVar21 < 0) {
              p_Var36 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var36 == iVar35._M_node) goto LAB_003254d0;
              p_Var36 = (_Base_ptr)std::_Rb_tree_increment(iVar35._M_node);
              __p = (_Link_type)(p_Var36 + 1);
              iVar21 = std::__cxx11::string::compare((string *)__k);
              if (iVar21 < 0) {
                iVar64._M_node = (iVar35._M_node)->_M_right;
                if ((iVar35._M_node)->_M_right != (_Base_ptr)0x0) {
                  iVar35._M_node = p_Var36;
                  iVar64._M_node = p_Var36;
                }
                goto LAB_003254e4;
              }
              goto LAB_003254b8;
            }
            pVar67.second = (_Rb_tree_node_base *)0x0;
            pVar67.first = iVar35._M_node;
          }
        }
        p_Var61 = pVar67.second;
        iVar35._M_node = pVar67.first;
        if (p_Var61 == (_Rb_tree_node_base *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                          *)this_01,__p);
        }
        else {
          bVar19 = true;
          if ((iVar35._M_node == (_Base_ptr)0x0) && (local_4d0 != p_Var61)) {
            std::__cxx11::string::compare((string *)__k);
            bVar19 = (bool)(extraout_var >> 7);
          }
          std::_Rb_tree_insert_and_rebalance(bVar19,this_01,p_Var61,local_4d0);
          psVar1 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *psVar1 = *psVar1 + 1;
          iVar35._M_node = this_01;
        }
      }
      std::__cxx11::string::_M_assign((string *)(iVar35._M_node + 2));
      pcVar5 = this->GT->Makefile;
      local_698.int_ = 0x15;
      local_618._M_allocated_capacity = (size_type)&local_608;
      local_618._M_allocated_capacity =
           std::__cxx11::string::_M_create(&local_618._M_allocated_capacity,(ulong)&local_698);
      local_608._M_allocated_capacity._0_4_ = (undefined4)local_698.int_;
      local_608._M_local_buf[4] = (char)((ulong)local_698 >> 0x20);
      local_608._M_local_buf[5] = (char)((ulong)local_698 >> 0x28);
      local_608._M_local_buf[6] = (char)((ulong)local_698 >> 0x30);
      local_608._M_local_buf[7] = (char)((ulong)local_698 >> 0x38);
      *(undefined8 *)local_618._M_allocated_capacity = 0x59535f454b414d43;
      builtin_strncpy((char *)(local_618._M_allocated_capacity + 8),"SROOT_CO",8);
      builtin_strncpy((char *)(local_618._M_allocated_capacity + 0xd),"_COMPILE",8);
      local_618._8_8_ = local_698;
      *(local_618._M_allocated_capacity + local_698.string_) = '\0';
      pcVar25 = cmMakefile::GetDefinition(pcVar5,(string *)&local_618);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_allocated_capacity != &local_608) {
        operator_delete((void *)local_618._M_allocated_capacity,
                        CONCAT17(local_608._M_local_buf[7],
                                 CONCAT16(local_608._M_local_buf[6],
                                          CONCAT15(local_608._M_local_buf[5],
                                                   CONCAT14(local_608._M_local_buf[4],
                                                            local_608._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (pcVar25 == (char *)0x0) {
        local_608._8_5_ = 0x544f4f5253;
        local_608._M_allocated_capacity._0_4_ = 0x4b414d43;
        local_608._M_local_buf[4] = 'E';
        local_608._M_local_buf[5] = '_';
        local_608._M_local_buf[6] = 'S';
        local_608._M_local_buf[7] = 'Y';
        local_618._8_8_ = 0xd;
        local_608._M_local_buf[0xd] = '\0';
        local_618._M_allocated_capacity = (size_type)&local_608;
        pcVar25 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_allocated_capacity != &local_608) {
          operator_delete((void *)local_618._M_allocated_capacity,
                          CONCAT17(local_608._M_local_buf[7],
                                   CONCAT16(local_608._M_local_buf[6],
                                            CONCAT15(local_608._M_local_buf[5],
                                                     CONCAT14(local_608._M_local_buf[4],
                                                              local_608._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
        if (pcVar25 != (char *)0x0) goto LAB_003256a6;
      }
      else {
LAB_003256a6:
        p_Var34 = iVar35._M_node[3]._M_parent;
        strlen(pcVar25);
        std::__cxx11::string::_M_replace
                  ((ulong)(iVar35._M_node + 3),0,(char *)p_Var34,(ulong)pcVar25);
      }
      pcVar26 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      local_618._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_608._M_allocated_capacity._0_4_ = local_608._M_allocated_capacity._0_4_ & 0xffffff00;
      local_618._M_allocated_capacity = (size_type)&local_608;
      cmLocalGenerator::GetTargetCompileFlags
                (pcVar26,this->GT,this->Config,(string *)local_620,(string *)&local_618);
      local_698.int_ = 0;
      auStack_690._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string,cmListFileBacktrace>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 (iVar35._M_node + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_618,
                 (cmListFileBacktrace *)&local_698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_690._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_690._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_allocated_capacity != &local_608) {
        operator_delete((void *)local_618._M_allocated_capacity,
                        CONCAT17(local_608._M_local_buf[7],
                                 CONCAT16(local_608._M_local_buf[6],
                                          CONCAT15(local_608._M_local_buf[5],
                                                   CONCAT14(local_608._M_local_buf[4],
                                                            local_608._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_618,pcVar26,this->GT,this->Config,(string *)local_620);
      CompileData::SetDefines
                ((CompileData *)(iVar35._M_node + 2),
                 (set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_618);
      local_590 = paVar39;
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_698,pcVar26,this->GT,(string *)local_620,this->Config);
      local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_690._0_8_;
      VVar53 = local_698;
      if (local_698.int_ != auStack_690._0_8_) {
        do {
          p_Var34 = local_620;
          VVar54 = VVar53;
          bVar19 = cmGeneratorTarget::IsSystemIncludeDirectory
                             (this->GT,VVar53,this->Config,(string *)local_620);
          local_658.bool_ = bVar19;
          pIVar38 = (pointer)iVar35._M_node[5]._M_right;
          if (pIVar38 == *(pointer *)(iVar35._M_node + 6)) {
            __first = (pointer)iVar35._M_node[5]._M_left;
            lVar45 = (long)iVar35._M_node[5]._M_right - (long)__first;
            if (lVar45 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar66 = (lVar45 >> 3) * 0x6db6db6db6db6db7;
            uVar50 = uVar66 + (uVar66 == 0);
            p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       *)(uVar50 + uVar66);
            if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 *)0x249249249249248 < p_Var57) {
              p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x249249249249249;
            }
            p_Var49 = (_Tp_alloc_type *)(uVar50 + uVar66);
            if (CARRY8(uVar50,uVar66)) {
              p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x249249249249249;
            }
            __result = std::
                       _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ::_M_allocate(p_Var57,VVar54.uint_);
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,BT<std::__cxx11::string>const&,bool>
                      ((allocator_type *)(((long)pIVar38 - (long)__first) + (long)__result),
                       (IncludeEntry *)VVar53.map_,
                       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_658,(bool *)p_Var49);
            pIVar37 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(__first,pIVar38,__result,p_Var49);
            pIVar38 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(pIVar38,pIVar38,pIVar37 + 1,p_Var49);
            if (__first != (pointer)0x0) {
              operator_delete(__first,*(long *)(iVar35._M_node + 6) - (long)__first);
            }
            iVar35._M_node[5]._M_left = (_Base_ptr)__result;
            iVar35._M_node[5]._M_right = (_Base_ptr)pIVar38;
            *(pointer *)(iVar35._M_node + 6) = __result + (long)p_Var57;
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,BT<std::__cxx11::string>const&,bool>
                      ((allocator_type *)pIVar38,(IncludeEntry *)VVar53.map_,
                       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_658,(bool *)p_Var34);
            iVar35._M_node[5]._M_right = (_Base_ptr)&iVar35._M_node[5]._M_right[1]._M_right;
          }
          VVar53.string_ = (char *)(VVar53.int_ + 0x30);
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)VVar53.int_ != local_628);
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_698);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_618);
      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_590);
    } while (paVar39 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_580);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_588);
  Json::Value::Value(&local_350,arrayValue);
  pKVar40 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  p_Var34 = (_Base_ptr)
            (pKVar40->Sources).
            super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_458 = (_Base_ptr)
              (pKVar40->Sources).
              super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var34 != local_458) {
    local_3b8 = &this->SourceGroupsLocal;
    local_3d8 = (_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 *)&this->SourceGroupsMap;
    local_3c8 = &this->CompileDataMap;
    local_3d0 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_3e8 = (_Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
                 *)&this->CompileGroupMap;
    local_3c0 = &(this->CompileGroupMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      AVar22 = Json::Value::size(&local_350);
      local_4d0 = (_Base_ptr)CONCAT44(local_4d0._4_4_,AVar22);
      Json::Value::Value(&local_2b0,objectValue);
      psVar23 = cmSourceFile::GetFullPath(*(cmSourceFile **)p_Var34,(string *)0x0);
      pcVar6 = (psVar23->_M_dataplus)._M_p;
      local_4a0[0].string_ = (char *)&local_490;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4a0,pcVar6,pcVar6 + psVar23->_M_string_length);
      RelativeIfUnder((string *)&local_618,local_3b0,(string *)local_4a0);
      Json::Value::Value(&local_58,(string *)&local_618);
      pVVar24 = Json::Value::operator[](&local_2b0,"path");
      Json::Value::operator=(pVVar24,&local_58);
      Json::Value::~Value(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._M_allocated_capacity != &local_608) {
        operator_delete((void *)local_618._M_allocated_capacity,
                        CONCAT17(local_608._M_local_buf[7],
                                 CONCAT16(local_608._M_local_buf[6],
                                          CONCAT15(local_608._M_local_buf[5],
                                                   CONCAT14(local_608._M_local_buf[4],
                                                            local_608._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (*(char *)(*(long *)p_Var34 + 0x129) == '\x01') {
        Json::Value::Value(&local_80,true);
        pVVar24 = Json::Value::operator[](&local_2b0,"isGenerated");
        Json::Value::operator=(pVVar24,&local_80);
        Json::Value::~Value(&local_80);
      }
      AddBacktrace(this,&local_2b0,(cmListFileBacktrace *)&p_Var34->_M_parent);
      local_620 = p_Var34;
      VVar53.map_ = (ObjectValues *)
                    cmMakefile::FindSourceGroup(this->GT->Makefile,(string *)local_4a0,local_3b8);
      if ((cmSourceGroup *)VVar53.int_ != (cmSourceGroup *)0x0) {
        uVar66 = (this->SourceGroupsMap)._M_h._M_bucket_count;
        uVar50 = VVar53.uint_ % uVar66;
        p_Var7 = (this->SourceGroupsMap)._M_h._M_buckets[uVar50];
        p_Var41 = (__node_base_ptr)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var41 = p_Var7, p_Var59 = p_Var7->_M_nxt,
           (cmSourceGroup *)p_Var7->_M_nxt[1]._M_nxt != (cmSourceGroup *)VVar53.int_)) {
          while (p_Var8 = p_Var59->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
            p_Var41 = (__node_base_ptr)0x0;
            if (((ulong)p_Var8[1]._M_nxt % uVar66 != uVar50) ||
               (p_Var41 = p_Var59, p_Var59 = p_Var8,
               (cmSourceGroup *)p_Var8[1]._M_nxt == (cmSourceGroup *)VVar53.int_))
            goto LAB_00325bf6;
          }
          p_Var41 = (__node_base_ptr)0x0;
        }
LAB_00325bf6:
        if (p_Var41 == (__node_base_ptr)0x0) {
          _Var42._M_cur = (__node_type *)0x0;
        }
        else {
          _Var42._M_cur = (__node_type *)p_Var41->_M_nxt;
        }
        local_588.map_ = VVar53.map_;
        if (_Var42._M_cur == (__node_type *)0x0) {
          local_698.int_._0_4_ =
               (int)((ulong)((long)(this->SourceGroups).
                                   super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->SourceGroups).
                                  super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
          pVar68 = std::
                   _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<cmSourceGroup*&,unsigned_int&>(local_3d8,&local_588,&local_698);
          _Var42._M_cur =
               (__node_type *)
               pVar68.first.
               super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
               ._M_cur;
          local_618._M_allocated_capacity = (size_type)&local_608;
          local_618._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_608._M_allocated_capacity._0_4_ = local_608._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          Json::Value::Value((Value *)&local_5f8,arrayValue);
          cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)local_588.map_);
          std::__cxx11::string::_M_assign((string *)local_618._M_local_buf);
          pSVar55 = (this->SourceGroups).
                    super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar55 ==
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pSVar15 = (this->SourceGroups).
                      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pSVar55 - (long)pSVar15 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar45 = (long)pSVar55 - (long)pSVar15 >> 3;
            uVar50 = lVar45 * -0x71c71c71c71c71c7;
            uVar66 = uVar50;
            if (pSVar55 == pSVar15) {
              uVar66 = 1;
            }
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(uVar66 + uVar50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1c71c71c71c71c6 < paVar39) {
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1c71c71c71c71c7;
            }
            if (CARRY8(uVar66,uVar50)) {
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1c71c71c71c71c7;
            }
            if (paVar39 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              pSVar43 = (pointer)0x0;
              __args_00 = __args;
            }
            else {
              pSVar43 = (pointer)operator_new((long)paVar39 * 0x48);
              __args_00 = extraout_RDX;
            }
            local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&(pSVar43->Name)._M_dataplus + lVar45);
            local_628 = paVar39;
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)local_590->_M_local_buf,(SourceGroup *)&local_618,__args_00
                      );
            pSVar65 = pSVar43;
            for (pSVar62 = pSVar15; pSVar55 != pSVar62; pSVar62 = pSVar62 + 1) {
              (pSVar65->Name)._M_dataplus._M_p = (pointer)&(pSVar65->Name).field_2;
              pcVar6 = (pSVar62->Name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pSVar65,pcVar6,pcVar6 + (pSVar62->Name)._M_string_length);
              Json::Value::Value(&pSVar65->SourceIndexes,&pSVar62->SourceIndexes);
              pSVar65 = pSVar65 + 1;
            }
            if (pSVar55 != pSVar15) {
              paVar39 = &(pSVar15->Name).field_2;
              do {
                Json::Value::~Value((Value *)(paVar39->_M_local_buf + 0x10));
                if (paVar39 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)(paVar39->_M_local_buf + -0x10)) {
                  operator_delete(*(long **)(paVar39->_M_local_buf + -0x10),
                                  paVar39->_M_allocated_capacity + 1);
                }
                pSVar62 = (pointer)(paVar39->_M_local_buf + 0x38);
                paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar39->_M_local_buf + 0x48);
              } while (pSVar62 != pSVar55);
            }
            if (pSVar15 != (pointer)0x0) {
              operator_delete(pSVar15,(long)(this->SourceGroups).
                                            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pSVar15);
            }
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar43;
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar65 + 1;
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar43 + (long)local_628;
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)pSVar55,(SourceGroup *)&local_618,__args);
            ppSVar2 = &(this->SourceGroups).
                       super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          Json::Value::~Value((Value *)&local_5f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._M_allocated_capacity != &local_608) {
            operator_delete((void *)local_618._M_allocated_capacity,
                            CONCAT17(local_608._M_local_buf[7],
                                     CONCAT16(local_608._M_local_buf[6],
                                              CONCAT15(local_608._M_local_buf[5],
                                                       CONCAT14(local_608._M_local_buf[4],
                                                                local_608._M_allocated_capacity.
                                                                _0_4_)))) + 1);
          }
        }
        uVar4 = *(uint *)((long)&((_Var42._M_cur)->
                                 super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                 ._M_storage._M_storage + 8);
        pSVar55 = (this->SourceGroups).
                  super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_618,(UInt)local_4d0);
        Json::Value::append(&pSVar55[uVar4].SourceIndexes,(Value *)&local_618);
        Json::Value::~Value((Value *)&local_618);
        Json::Value::Value(&local_a8,
                           *(UInt *)((long)&((_Var42._M_cur)->
                                            super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                            ._M_storage._M_storage + 8));
        pVVar24 = Json::Value::operator[](&local_2b0,"sourceGroupIndex");
        Json::Value::operator=(pVVar24,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      p_Var34 = local_620;
      if (*(SourceKind *)&local_620->_M_right == SourceKindObjectSource) {
        local_628 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)local_620;
        local_618._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_608._M_allocated_capacity._0_4_ = local_608._M_allocated_capacity._0_4_ & 0xffffff00;
        local_5f8.string_ = local_5e8;
        local_5f0 = 0;
        local_5e8[0] = 0;
        local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_5a8.int_ = 0;
        VStack_5a0.int_ = 0;
        local_5b8 = (string *)0x0;
        uStack_5b0 = 0;
        local_5c8 = 0;
        psStack_5c0 = (string *)0x0;
        local_5d8._0_8_ =
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )0x0;
        local_5d8._8_8_ =
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )0x0;
        local_618._M_allocated_capacity = (size_type)&local_608;
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_588,(cmSourceFile *)local_628);
        std::__cxx11::string::operator=((string *)local_618._M_local_buf,(string *)&local_588.bool_)
        ;
        if (local_588 != (cmSourceGroup *)(local_580 + 8)) {
          operator_delete(local_588.string_,CONCAT35(local_578._5_3_,local_578._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          iVar35 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                   ::lower_bound(local_3c8,(key_type *)&local_618);
          if ((iVar35._M_node == local_3d0) ||
             (iVar21 = std::__cxx11::string::compare((string *)local_618._M_local_buf), iVar21 < 0))
          {
            std::__throw_out_of_range("map::at");
LAB_003277dc:
            std::__throw_length_error("vector::_M_range_insert");
          }
          std::__cxx11::string::_M_assign((string *)&local_5f8.bool_);
          local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cmGeneratorTarget::GetLocalGenerator(this->GT);
          local_520[0].string_ = (char *)&local_510;
          pcVar6 = (this->Config->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_520,pcVar6,pcVar6 + this->Config->_M_string_length);
          headTarget = this->GT;
          local_4c8.string_ = (char *)&local_4b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,local_618._M_allocated_capacity,
                     (char *)(local_618._8_8_ + local_618._M_allocated_capacity));
          cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                    ((cmGeneratorExpressionInterpreter *)&local_588,(cmLocalGenerator *)local_590,
                     (string *)local_520,headTarget,(string *)&local_4c8);
          if (local_4c8 != &local_4b8) {
            operator_delete(local_4c8.string_,local_4b8._M_allocated_capacity + 1);
          }
          if (local_520[0] != &local_510) {
            operator_delete(local_520[0].string_,local_510._M_allocated_capacity + 1);
          }
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_5d8,
                      (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(iVar35._M_node + 4));
          local_4f8.string_ = (char *)&local_4e8;
          local_4e8._8_5_ = 0x5347414c46;
          local_4e8._M_allocated_capacity._0_5_ = 0x49504d4f43;
          local_4e8._M_allocated_capacity._5_3_ = 0x5f454c;
          paStack_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xd;
          local_4e8._M_local_buf[0xd] = '\0';
          pcVar25 = cmSourceFile::GetProperty((cmSourceFile *)local_628,(string *)&local_4f8);
          if (pcVar25 != (char *)0x0) {
            psVar23 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_588,pcVar25,
                                 (string *)&local_4f8);
            local_698.string_ = auStack_690 + 8;
            pcVar6 = (psVar23->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_698,pcVar6,pcVar6 + psVar23->_M_string_length);
            local_658.int_ = 0;
            paStack_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string,cmListFileBacktrace>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       local_5d8._M_local_buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_698,(cmListFileBacktrace *)&local_658);
            if (paStack_650 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paStack_650);
            }
            if (local_698 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(auStack_690 + 8)) {
              operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
            }
          }
          local_480.string_ = (char *)&local_470;
          local_470._8_7_ = 0x534e4f4954504f;
          local_470._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
          local_470._M_local_buf[7] = '_';
          local_478 = (char *)0xf;
          local_470._M_local_buf[0xf] = '\0';
          pcVar25 = cmSourceFile::GetProperty((cmSourceFile *)local_628,(string *)&local_480);
          if (pcVar25 != (char *)0x0) {
            local_698.string_ = auStack_690 + 8;
            auStack_690._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            auStack_690._8_8_ = auStack_690._8_8_ & 0xffffffffffffff00;
            psVar23 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_588,pcVar25,
                                 (string *)&local_480);
            cmLocalGenerator::AppendCompileOptions
                      ((cmLocalGenerator *)local_590,(string *)&local_698,
                       (psVar23->_M_dataplus)._M_p,(char *)0x0);
            local_658.int_ = 0;
            paStack_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string,cmListFileBacktrace>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       local_5d8._M_local_buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_698,(cmListFileBacktrace *)&local_658);
            if (paStack_650 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paStack_650);
            }
            if (local_698 != auStack_690 + 8) {
              operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
            }
          }
          local_658.int_ = 0;
          paStack_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_648._M_allocated_capacity = 0;
          local_698.string_ = auStack_690 + 8;
          local_450._M_dataplus._M_p = (pointer)0x13;
          VVar53.string_ = (char *)&local_698;
          local_698.int_ =
               std::__cxx11::string::_M_create((ulong *)VVar53.string_,(ulong)&local_450);
          auStack_690._8_8_ = local_450._M_dataplus._M_p;
          builtin_strncpy((char *)local_698,"INCLUDE_",8);
          *(undefined8 *)
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(local_698.map_)->_M_t)->_M_local_buf + 8) = 0x524f544345524944;
          (((_Rep_type *)local_698)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'R';
          *(char *)&(((_Rep_type *)local_698)->_M_impl).super__Rb_tree_header._M_header._M_parent =
               'I';
          *(char *)((long)&(((_Rep_type *)local_698)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 1) = 'E';
          *(char *)((long)&(((_Rep_type *)local_698)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 2) = 'S';
          auStack_690._0_8_ = local_450._M_dataplus._M_p;
          local_698.string_[(long)local_450._M_dataplus._M_p] = '\0';
          local_3e0 = iVar35._M_node;
          pcVar25 = cmSourceFile::GetProperty((cmSourceFile *)local_628,(string *)VVar53.map_);
          if (pcVar25 != (char *)0x0) {
            psVar23 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_588,pcVar25,
                                 (string *)&local_698);
            VVar53.string_ = (char *)&local_658;
            cmLocalGenerator::AppendIncludeDirectories
                      ((cmLocalGenerator *)local_590,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)VVar53.map_,(psVar23->_M_dataplus)._M_p,(cmSourceFile *)local_628);
            paVar39 = paStack_650;
            for (VVar54 = local_658; VVar54 != paVar39;
                VVar54.string_ =
                     (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&(VVar54.map_)->_M_t + 2)) {
              language = &local_618;
              VVar47 = VVar54;
              bVar19 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 (this->GT,VVar54,this->Config,(string *)language);
              VVar53 = VStack_5a0;
              VVar58 = local_5a8;
              local_450._M_dataplus._M_p._0_1_ = bVar19;
              if (VStack_5a0 == local_598) {
                lVar45 = (long)VStack_5a0.string_ - (long)local_5a8;
                if (lVar45 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar66 = (lVar45 >> 3) * 0x6db6db6db6db6db7;
                uVar50 = uVar66 + (uVar66 == 0);
                p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)(uVar50 + uVar66);
                if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     *)0x249249249249248 < p_Var57) {
                  p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                             *)0x249249249249249;
                }
                p_Var49 = (_Tp_alloc_type *)(uVar50 + uVar66);
                if (CARRY8(uVar50,uVar66)) {
                  p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                             *)0x249249249249249;
                }
                VVar44.map_ = (ObjectValues *)
                              std::
                              _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                              ::_M_allocate(p_Var57,VVar47.uint_);
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
                construct<(anonymous_namespace)::CompileData::IncludeEntry,std::__cxx11::string_const&,bool_const&>
                          ((allocator_type *)(VVar44.string_ + lVar45),(IncludeEntry *)VVar54.map_,
                           &local_450,(bool *)p_Var49);
                VVar47.int_ = (LargestInt)
                              std::
                              vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                              ::_S_relocate(VVar58.int_,VVar53.int_,(pointer)VVar44.map_,p_Var49);
                if (VVar58 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0) {
                  VVar53.string_ = local_598->_M_local_buf + -VVar58.int_;
                  operator_delete(VVar58.string_,VVar53.uint_);
                }
                local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(VVar44.int_ + (long)p_Var57 * 0x38);
                local_5a8.map_ = VVar44.map_;
              }
              else {
                VVar53 = VVar54;
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
                construct<(anonymous_namespace)::CompileData::IncludeEntry,std::__cxx11::string_const&,bool_const&>
                          ((allocator_type *)VStack_5a0.map_,(IncludeEntry *)VVar54.map_,&local_450,
                           (bool *)language->_M_local_buf);
                VVar47 = VStack_5a0;
              }
              VStack_5a0.string_ = (char *)(VVar47.int_ + 0x38);
            }
          }
          if (local_698 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(auStack_690 + 8)) {
            VVar53.string_ = (char *)(auStack_690._8_8_ + 1);
            operator_delete(local_698.string_,VVar53.uint_);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_658);
          VVar54 = VStack_5a0;
          p_Var34 = local_3e0[5]._M_left;
          p_Var9 = local_3e0[5]._M_right;
          if (p_Var34 != p_Var9) {
            uVar66 = (long)p_Var9 - (long)p_Var34;
            if ((ulong)((long)local_598 - (long)VStack_5a0) < uVar66) {
              uVar50 = ((long)uVar66 >> 3) * 0x6db6db6db6db6db7;
              lVar45 = (long)VStack_5a0.string_ - (long)local_5a8 >> 3;
              uVar46 = lVar45 * 0x6db6db6db6db6db7;
              if (lVar45 * -0x6db6db6db6db6db7 + 0x249249249249249U < uVar50) goto LAB_003277dc;
              if (uVar50 <= uVar46 && uVar46 + ((long)uVar66 >> 3) * -0x6db6db6db6db6db7 != 0) {
                uVar50 = uVar46;
              }
              p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)(uVar50 + uVar46);
              if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)0x249249249249248 < p_Var57) {
                p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x249249249249249;
              }
              if (CARRY8(uVar50,uVar46)) {
                p_Var57 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x249249249249249;
              }
              VVar47.map_ = (ObjectValues *)
                            std::
                            _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                            ::_M_allocate(p_Var57,VVar53.uint_);
              VVar53.map_ = VVar47.map_;
              for (VVar58 = local_5a8; VVar58.int_ != VVar54.int_;
                  VVar58.string_ = (char *)(VVar58.int_ + 0x38)) {
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)VVar53.string_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(VVar53.int_ + 0x10);
                paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(VVar58.int_ + 0x10);
                if (paVar39 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)VVar58.string_) {
                  lVar45 = *(long *)((long)&(VVar58.map_)->_M_t + 0x18);
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(VVar53.int_ + 0x10))->_M_allocated_capacity = paVar39->_M_allocated_capacity;
                  *(long *)((long)&(VVar53.map_)->_M_t + 0x18) = lVar45;
                }
                else {
                  *(long **)VVar53.string_ = *(long **)VVar58.string_;
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(VVar53.int_ + 0x10))->_M_allocated_capacity = paVar39->_M_allocated_capacity;
                }
                *(size_type *)((long)&(VVar53.map_)->_M_t + 8) =
                     *(size_type *)((long)&(VVar58.map_)->_M_t + 8);
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)VVar58.string_ = paVar39;
                *(size_type *)((long)&(VVar58.map_)->_M_t + 8) = 0;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar58.int_ + 0x10))->_M_local_buf[0] = '\0';
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar53.int_ + 0x20))->_M_allocated_capacity =
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(VVar58.int_ + 0x20))->_M_allocated_capacity;
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(VVar53.map_)->_M_t + 0x28))
                ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var10 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(VVar58.map_)->_M_t + 0x28))->_M_pi;
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(VVar58.map_)->_M_t + 0x28))
                ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(VVar53.map_)->_M_t + 0x28))
                ->_M_pi = p_Var10;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar58.int_ + 0x20))->_M_allocated_capacity = 0;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar53.int_ + 0x30))->_M_local_buf[0] =
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(VVar58.int_ + 0x30))->_M_local_buf[0];
                VVar53.string_ = (char *)(VVar53.int_ + 0x38);
              }
              do {
                VVar44 = VVar53;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)VVar44.string_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(VVar44.int_ + 0x10);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)VVar44.int_,*(long *)p_Var34,
                           (long)&p_Var34->_M_parent->_M_color + *(long *)p_Var34);
                VVar58 = VStack_5a0;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar44.int_ + 0x20))->_M_allocated_capacity = *(size_type *)(p_Var34 + 1);
                p_Var11 = p_Var34[1]._M_parent;
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(VVar44.map_)->_M_t + 0x28))
                ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11;
                if (p_Var11 != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&p_Var11->_M_parent = *(int *)&p_Var11->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&p_Var11->_M_parent = *(int *)&p_Var11->_M_parent + 1;
                  }
                }
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar44.int_ + 0x30))->_M_local_buf[0] = *(char *)&p_Var34[1]._M_left;
                p_Var34 = (_Base_ptr)&p_Var34[1]._M_right;
                VVar53.string_ = (char *)(VVar44.int_ + 0x38);
              } while (p_Var34 != p_Var9);
              VVar17 = local_5a8;
              if (VStack_5a0.int_ != VVar54.int_) {
                lVar45 = 0;
                do {
                  lVar60 = lVar45;
                  pcVar25 = VVar53.string_ + lVar60;
                  *(char **)pcVar25 = pcVar25 + 0x10;
                  plVar51 = (long *)(VVar54.string_ + lVar60 + 0x10);
                  if (plVar51 == *(long **)(VVar54.string_ + lVar60)) {
                    uVar56 = *(undefined8 *)(VVar54.string_ + lVar60 + 0x18);
                    *(long *)(pcVar25 + 0x10) = *plVar51;
                    *(undefined8 *)(pcVar25 + 0x18) = uVar56;
                  }
                  else {
                    *(long **)(VVar53.string_ + lVar60) = *(long **)(VVar54.string_ + lVar60);
                    *(long *)((long)(VVar53.string_ + lVar60) + 0x10) = *plVar51;
                  }
                  *(undefined8 *)
                   ((long)&(((pointer)(VVar44.int_ + 0x38))->Path).Value._M_string_length + lVar60)
                       = *(undefined8 *)(VVar54.string_ + lVar60 + 8);
                  *(long **)(VVar54.string_ + lVar60) = plVar51;
                  pcVar25 = VVar54.string_ + lVar60 + 8;
                  pcVar25[0] = '\0';
                  pcVar25[1] = '\0';
                  pcVar25[2] = '\0';
                  pcVar25[3] = '\0';
                  pcVar25[4] = '\0';
                  pcVar25[5] = '\0';
                  pcVar25[6] = '\0';
                  pcVar25[7] = '\0';
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(VVar54.map_)->_M_t)->_M_local_buf[lVar60 + 0x10] = '\0';
                  *(undefined8 *)
                   ((long)&(((pointer)(VVar44.int_ + 0x38))->Path).Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar60) = *(undefined8 *)(VVar54.string_ + lVar60 + 0x20);
                  *(undefined8 *)
                   ((long)&(((pointer)(VVar44.int_ + 0x38))->Path).Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar60) = 0;
                  uVar56 = *(undefined8 *)(VVar54.string_ + lVar60 + 0x28);
                  pcVar25 = VVar54.string_ + lVar60 + 0x28;
                  pcVar25[0] = '\0';
                  pcVar25[1] = '\0';
                  pcVar25[2] = '\0';
                  pcVar25[3] = '\0';
                  pcVar25[4] = '\0';
                  pcVar25[5] = '\0';
                  pcVar25[6] = '\0';
                  pcVar25[7] = '\0';
                  *(undefined8 *)
                   ((long)&(((pointer)(VVar44.int_ + 0x38))->Path).Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar60) = uVar56;
                  pcVar25 = VVar54.string_ + lVar60 + 0x20;
                  pcVar25[0] = '\0';
                  pcVar25[1] = '\0';
                  pcVar25[2] = '\0';
                  pcVar25[3] = '\0';
                  pcVar25[4] = '\0';
                  pcVar25[5] = '\0';
                  pcVar25[6] = '\0';
                  pcVar25[7] = '\0';
                  (&((pointer)(VVar44.int_ + 0x38))->IsSystem)[lVar60] =
                       (bool)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(VVar54.int_ + 0x30))->_M_local_buf[lVar60];
                  lVar45 = lVar60 + 0x38;
                } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(VVar54.string_ + lVar60 + 0x38) != VStack_5a0);
                VVar53.string_ = VVar44.string_ + lVar60 + 0x70;
              }
              for (; VVar17.int_ != VVar58.int_; VVar17.string_ = (char *)(VVar17.int_ + 0x38)) {
                p_Var10 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(VVar17.map_)->_M_t + 0x28))->_M_pi;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(VVar17.int_ + 0x10) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)VVar17.string_) {
                  operator_delete(*(long **)VVar17.string_,
                                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(VVar17.int_ + 0x10))->_M_allocated_capacity + 1);
                }
              }
              if (local_5a8 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_5a8.string_,(long)local_598 - (long)local_5a8);
              }
              local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(VVar47.int_ + (long)p_Var57 * 0x38);
              local_5a8.map_ = VVar47.map_;
              VStack_5a0 = VVar53;
            }
            else {
              do {
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)VVar54.string_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(VVar54.int_ + 0x10);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)VVar54.int_,*(long *)p_Var34,
                           (long)&p_Var34->_M_parent->_M_color + *(long *)p_Var34);
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar54.int_ + 0x20))->_M_allocated_capacity = *(size_type *)(p_Var34 + 1);
                p_Var11 = p_Var34[1]._M_parent;
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(VVar54.map_)->_M_t + 0x28))
                ->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11;
                if (p_Var11 != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&p_Var11->_M_parent = *(int *)&p_Var11->_M_parent + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&p_Var11->_M_parent = *(int *)&p_Var11->_M_parent + 1;
                  }
                }
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar54.int_ + 0x30))->_M_local_buf[0] = *(char *)&p_Var34[1]._M_left;
                p_Var34 = (_Base_ptr)&p_Var34[1]._M_right;
                VVar54.string_ = (char *)(VVar54.int_ + 0x38);
              } while (p_Var34 != p_Var9);
              VStack_5a0.string_ = VStack_5a0.string_ + uVar66;
            }
          }
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          local_698.int_ = 0x13;
          local_450._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_450,(ulong)&local_698);
          local_450.field_2._M_allocated_capacity = (size_type)local_698;
          *(undefined8 *)local_450._M_dataplus._M_p = 0x5f454c49504d4f43;
          *(undefined8 *)((long)local_450._M_dataplus._M_p + 8) = 0x4954494e49464544;
          builtin_strncpy((char *)((long)local_450._M_dataplus._M_p + 0xf),"IONS",4);
          local_450._M_string_length = (size_type)local_698;
          local_450._M_dataplus._M_p[local_698.string_] = '\0';
          auStack_690._0_8_ = auStack_690._0_8_ & 0xffffffff00000000;
          auStack_690._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_680._M_node = (_Base_ptr)auStack_690;
          local_670 = 0;
          local_678 = local_680._M_node;
          pcVar25 = cmSourceFile::GetProperty((cmSourceFile *)local_628,&local_450);
          if (pcVar25 != (char *)0x0) {
            psVar23 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_588,pcVar25,&local_450);
            cmLocalGenerator::AppendDefines
                      ((cmLocalGenerator *)local_590,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_698,psVar23);
          }
          cmsys::SystemTools::UpperCase((string *)&local_658,this->Config);
          plVar51 = (long *)std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,0x54387e);
          paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar51 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar51 == paVar39) {
            local_408.field_2._M_allocated_capacity = paVar39->_M_allocated_capacity;
            local_408.field_2._8_8_ = plVar51[3];
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          }
          else {
            local_408.field_2._M_allocated_capacity = paVar39->_M_allocated_capacity;
            local_408._M_dataplus._M_p = (pointer)*plVar51;
          }
          local_408._M_string_length = plVar51[1];
          *plVar51 = (long)paVar39;
          plVar51[1] = 0;
          *(undefined1 *)(plVar51 + 2) = 0;
          if (local_658 != &local_648) {
            operator_delete(local_658.string_,local_648._M_allocated_capacity + 1);
          }
          pcVar25 = cmSourceFile::GetProperty((cmSourceFile *)local_628,&local_408);
          if (pcVar25 != (char *)0x0) {
            psVar23 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_588,pcVar25,&local_450);
            cmLocalGenerator::AppendDefines
                      ((cmLocalGenerator *)local_590,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_698,psVar23);
          }
          paStack_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)paStack_650 & 0xffffffff00000000);
          local_648._M_allocated_capacity = 0;
          local_630 = 0;
          local_648._8_8_ = (_Base_ptr)&paStack_650;
          local_638 = (_Base_ptr)&paStack_650;
          std::
          _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                    ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                      *)&local_658.bool_,local_680,(_Base_ptr)auStack_690);
          pBVar12 = *(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)(local_3e0 + 5);
          local_3a8._M_t =
               (_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_658;
          for (__v = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_3e0[4]._M_right; __v != pBVar12; __v = __v + 1) {
            std::
            _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
            ::
            _M_insert_unique_<BT<std::__cxx11::string>const&,std::_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>::_Alloc_node>
                      ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                        *)&local_658.bool_,(_Base_ptr)&paStack_650,__v,&local_3a8);
          }
          CompileData::SetDefines
                    ((CompileData *)&local_618,
                     (set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_658);
          std::
          _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_658);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_698);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p,
                            (ulong)(local_450.field_2._M_allocated_capacity + 1));
          }
          if (local_480 != &local_470) {
            operator_delete(local_480.string_,
                            CONCAT17(local_470._M_local_buf[7],local_470._M_allocated_capacity._0_7_
                                    ) + 1);
          }
          if (local_4f8 != &local_4e8) {
            operator_delete(local_4f8.string_,
                            CONCAT35(local_4e8._M_allocated_capacity._5_3_,
                                     local_4e8._M_allocated_capacity._0_5_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._56_8_ != &local_530) {
            operator_delete((void *)local_578._56_8_,local_530._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._16_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_578 + 0x20)) {
            operator_delete((void *)local_578._16_8_,(ulong)(local_578._32_8_ + 1));
          }
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)(local_580 + 8));
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_588);
        }
        Json::Value::Value((Value *)&local_430,objectValue);
        psVar23 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          Json::Value::Value((Value *)&local_658,(string *)&local_618);
          pVVar24 = Json::Value::operator[]((Value *)&local_430,"language");
          Json::Value::operator=(pVVar24,(Value *)&local_658);
          Json::Value::~Value((Value *)&local_658);
          psVar23 = extraout_RDX_01;
        }
        if (local_5f0 != 0) {
          DumpSysroot((Value *)local_520,(Target *)&local_5f8,psVar23);
          pVVar24 = Json::Value::operator[]((Value *)&local_430,"sysroot");
          Json::Value::operator=(pVVar24,(Value *)local_520);
          Json::Value::~Value((Value *)local_520);
        }
        if (local_5d8._0_8_ != local_5d8._8_8_) {
          Json::Value::Value((Value *)&local_4c8,arrayValue);
          uVar56 = local_5d8._8_8_;
          for (frag = local_5d8._0_8_; frag != uVar56; frag = frag + 0x30) {
            local_698.string_ = auStack_690 + 8;
            auStack_690._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            auStack_690._8_8_ = auStack_690._8_8_ & 0xffffffffffffff00;
            DumpCommandFragment((Value *)&local_588,this,
                                (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)frag,(string *)&local_698);
            Json::Value::append((Value *)&local_4c8,(Value *)&local_588);
            Json::Value::~Value((Value *)&local_588);
            if (local_698 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(auStack_690 + 8)) {
              operator_delete(local_698.string_,(ulong)(auStack_690._8_8_ + 1));
            }
          }
          pVVar24 = Json::Value::operator[]((Value *)&local_430,"compileCommandFragments");
          Json::Value::operator=(pVVar24,(Value *)&local_4c8);
          Json::Value::~Value((Value *)&local_4c8);
        }
        if (local_5a8.int_ != VStack_5a0.int_) {
          Json::Value::Value((Value *)&local_4f8,arrayValue);
          VVar54 = VStack_5a0;
          for (VVar53 = local_5a8; VVar53.int_ != VVar54.int_;
              VVar53.string_ = (char *)(VVar53.int_ + 0x38)) {
            Json::Value::Value((Value *)&local_480,objectValue);
            Json::Value::Value((Value *)&local_588,(string *)VVar53.map_);
            pVVar24 = Json::Value::operator[]((Value *)&local_480,"path");
            Json::Value::operator=(pVVar24,(Value *)&local_588);
            Json::Value::~Value((Value *)&local_588);
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(VVar53.int_ + 0x30))->_M_local_buf[0] == '\x01') {
              Json::Value::Value((Value *)&local_698,true);
              pVVar24 = Json::Value::operator[]((Value *)&local_480,"isSystem");
              Json::Value::operator=(pVVar24,(Value *)&local_698);
              Json::Value::~Value((Value *)&local_698);
            }
            AddBacktrace(this,(Value *)&local_480,(cmListFileBacktrace *)(VVar53.int_ + 0x20));
            Json::Value::append((Value *)&local_4f8,(Value *)&local_480);
            Json::Value::~Value((Value *)&local_480);
          }
          Json::Value::Value((Value *)&local_698,(Value *)&local_4f8);
          pVVar24 = Json::Value::operator[]((Value *)&local_430,"includes");
          Json::Value::operator=(pVVar24,(Value *)&local_698);
          Json::Value::~Value((Value *)&local_698);
          Json::Value::~Value((Value *)&local_4f8);
        }
        if (psStack_5c0 != local_5b8) {
          Json::Value::Value((Value *)&local_4f8,arrayValue);
          psVar27 = local_5b8;
          for (psVar23 = psStack_5c0; psVar23 != psVar27; psVar23 = (string *)&psVar23[1].field_2) {
            Json::Value::Value((Value *)&local_480,objectValue);
            Json::Value::Value((Value *)&local_588,psVar23);
            pVVar24 = Json::Value::operator[]((Value *)&local_480,"define");
            Json::Value::operator=(pVVar24,(Value *)&local_588);
            Json::Value::~Value((Value *)&local_588);
            AddBacktrace(this,(Value *)&local_480,(cmListFileBacktrace *)(psVar23 + 1));
            Json::Value::append((Value *)&local_4f8,(Value *)&local_480);
            Json::Value::~Value((Value *)&local_480);
          }
          Json::Value::Value((Value *)&local_588,(Value *)&local_4f8);
          pVVar24 = Json::Value::operator[]((Value *)&local_430,"defines");
          Json::Value::operator=(pVVar24,(Value *)&local_588);
          Json::Value::~Value((Value *)&local_588);
          Json::Value::~Value((Value *)&local_4f8);
        }
        CompileData::~CompileData((CompileData *)&local_618);
        VVar53 = (ValueHolder)
                 std::
                 _Rb_tree<Json::Value,_std::pair<const_Json::Value,_unsigned_int>,_std::_Select1st<std::pair<const_Json::Value,_unsigned_int>_>,_std::less<Json::Value>,_std::allocator<std::pair<const_Json::Value,_unsigned_int>_>_>
                 ::find((_Rb_tree<Json::Value,_std::pair<const_Json::Value,_unsigned_int>,_std::_Select1st<std::pair<const_Json::Value,_unsigned_int>_>,_std::less<Json::Value>,_std::allocator<std::pair<const_Json::Value,_unsigned_int>_>_>
                         *)local_3e8,(key_type *)&local_430);
        if ((_Base_ptr)VVar53.int_ == local_3c0) {
          local_698.int_._0_4_ =
               (int)((ulong)((long)(this->CompileGroups).
                                   super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->CompileGroups).
                                  super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
          pVar69 = std::
                   _Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
                   ::_M_emplace_unique<Json::Value,unsigned_int&>
                             (local_3e8,(Value *)&local_430,(uint *)&local_698.uint_);
          VVar53.int_ = (LargestInt)pVar69.first._M_node;
          local_588.int_ = 0;
          Json::Value::Value((Value *)local_580,arrayValue);
          pVVar13 = (ValueHolder *)
                    (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_588.int_ = VVar53.int_;
          if (pVVar13 ==
              (ValueHolder *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pVVar14 = (ValueHolder *)
                      (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pVVar13 - (long)pVVar14 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar45 = (long)pVVar13 - (long)pVVar14 >> 4;
            uVar50 = lVar45 * -0x5555555555555555;
            uVar66 = uVar50;
            if (pVVar13 == pVVar14) {
              uVar66 = 1;
            }
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(uVar66 + uVar50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2aaaaaaaaaaaaa9 < paVar39) {
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x2aaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar66,uVar50)) {
              paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x2aaaaaaaaaaaaaa;
            }
            if (paVar39 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              pCVar48 = (pointer)0x0;
            }
            else {
              pCVar48 = (pointer)operator_new((long)paVar39 * 0x30);
            }
            local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ValueHolder *)(&pCVar48->Entry + lVar45 * 2) + 1);
            ((ValueHolder *)(&pCVar48->Entry + lVar45 * 2))->int_ = (LargestInt)local_588;
            Json::Value::Value((Value *)local_590,(Value *)local_580);
            pVVar18 = pVVar14;
            pCVar63 = pCVar48;
            if (pVVar13 != pVVar14) {
              lVar45 = 8;
              lVar60 = 0;
              local_628 = paVar39;
              do {
                pVVar24 = (Value *)(lVar45 + (long)pVVar14);
                *(undefined8 *)((long)pCVar48 + lVar45 + -8) =
                     *(undefined8 *)((long)pVVar14 + lVar45 + -8);
                Json::Value::Value((Value *)((long)&(pCVar48->Entry)._M_node + lVar45),pVVar24);
                lVar60 = lVar60 + -0x30;
                lVar45 = lVar45 + 0x30;
              } while (&pVVar24[1].value_ != pVVar13);
              pCVar63 = (pointer)((long)pCVar48 - lVar60);
              paVar39 = local_628;
            }
            for (; pVVar13 != pVVar18; pVVar18 = pVVar18 + 6) {
              Json::Value::~Value((Value *)(pVVar18 + 1));
            }
            if (pVVar14 != (ValueHolder *)0x0) {
              operator_delete(pVVar14,(long)(this->CompileGroups).
                                            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pVVar14);
            }
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start = pCVar48;
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pCVar63 + 0x30);
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar48 + (long)paVar39;
          }
          else {
            pVVar13->int_ = (LargestInt)VVar53;
            Json::Value::Value((Value *)(pVVar13 + 1),(Value *)local_580);
            ppCVar3 = &(this->CompileGroups).
                       super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar3 = *ppCVar3 + 1;
          }
          Json::Value::~Value((Value *)local_580);
        }
        uVar4 = *(uint *)(VVar53.int_ + 0x48);
        pCVar48 = (this->CompileGroups).
                  super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_588,(UInt)local_4d0);
        Json::Value::append(&pCVar48[uVar4].SourceIndexes,(Value *)&local_588);
        Json::Value::~Value((Value *)&local_588);
        value = *(UInt *)(VVar53.int_ + 0x48);
        Json::Value::~Value((Value *)&local_430);
        Json::Value::Value((Value *)&local_618,value);
        p_Var34 = local_620;
        pVVar24 = Json::Value::operator[](&local_2b0,"compileGroupIndex");
        Json::Value::operator=(pVVar24,(Value *)&local_618);
        Json::Value::~Value((Value *)&local_618);
      }
      if (local_4a0[0] != &local_490) {
        operator_delete(local_4a0[0].string_,local_490._M_allocated_capacity + 1);
      }
      Json::Value::append(&local_350,&local_2b0);
      Json::Value::~Value(&local_2b0);
      p_Var34 = p_Var34 + 1;
    } while (p_Var34 != local_458);
  }
  pVVar24 = Json::Value::operator[](local_660,"sources");
  Json::Value::operator=(pVVar24,&local_350);
  Json::Value::~Value(&local_350);
  Json::Value::Value((Value *)&local_658,nullValue);
  local_608._M_allocated_capacity._0_4_ = 0x444c4f46;
  local_608._M_local_buf[4] = 'E';
  local_608._M_local_buf[5] = 'R';
  local_618._8_8_ = 6;
  local_608._M_local_buf[6] = '\0';
  local_618._M_allocated_capacity = (size_type)&local_608;
  pcVar25 = cmGeneratorTarget::GetProperty(this->GT,(string *)&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_allocated_capacity != &local_608) {
    operator_delete((void *)local_618._M_allocated_capacity,
                    CONCAT17(local_608._M_local_buf[7],
                             CONCAT16(local_608._M_local_buf[6],
                                      CONCAT15(local_608._M_local_buf[5],
                                               CONCAT14(local_608._M_local_buf[4],
                                                        local_608._M_allocated_capacity._0_4_)))) +
                    1);
  }
  if (pcVar25 != (char *)0x0) {
    Json::Value::Value((Value *)&local_618,objectValue);
    Json::Value::operator=((Value *)&local_658,(Value *)&local_618);
    Json::Value::~Value((Value *)&local_618);
    Json::Value::Value((Value *)&local_588,pcVar25);
    pVVar24 = Json::Value::operator[]((Value *)&local_658,"name");
    Json::Value::operator=(pVVar24,(Value *)&local_588);
    Json::Value::~Value((Value *)&local_588);
  }
  bVar19 = Json::Value::isNull((Value *)&local_658);
  if (!bVar19) {
    Json::Value::Value(&local_210,(Value *)&local_658);
    pVVar24 = Json::Value::operator[](local_660,"folder");
    Json::Value::operator=(pVVar24,&local_210);
    Json::Value::~Value(&local_210);
  }
  Json::Value::Value((Value *)local_520,arrayValue);
  pSVar55 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar15 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar55 != pSVar15) {
    do {
      Json::Value::Value((Value *)&local_698,objectValue);
      Json::Value::Value((Value *)&local_618,&pSVar55->Name);
      pVVar24 = Json::Value::operator[]((Value *)&local_698,"name");
      Json::Value::operator=(pVVar24,(Value *)&local_618);
      Json::Value::~Value((Value *)&local_618);
      Json::Value::Value((Value *)&local_588,&pSVar55->SourceIndexes);
      pVVar24 = Json::Value::operator[]((Value *)&local_698,"sourceIndexes");
      Json::Value::operator=(pVVar24,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
      Json::Value::append((Value *)local_520,(Value *)&local_698);
      Json::Value::~Value((Value *)&local_698);
      pSVar55 = pSVar55 + 1;
    } while (pSVar55 != pSVar15);
  }
  bVar19 = Json::Value::empty((Value *)local_520);
  if (!bVar19) {
    Json::Value::Value(&local_238,(Value *)local_520);
    pVVar24 = Json::Value::operator[](local_660,"sourceGroups");
    Json::Value::operator=(pVVar24,&local_238);
    Json::Value::~Value(&local_238);
  }
  Json::Value::Value((Value *)&local_698,arrayValue);
  pCVar48 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar63 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar48 != pCVar63) {
    do {
      Json::Value::Value((Value *)&local_588,(Value *)((pCVar48->Entry)._M_node + 1));
      Json::Value::Value((Value *)&local_618,&pCVar48->SourceIndexes);
      pVVar24 = Json::Value::operator[]((Value *)&local_588,"sourceIndexes");
      Json::Value::operator=(pVVar24,(Value *)&local_618);
      Json::Value::~Value((Value *)&local_618);
      Json::Value::append((Value *)&local_698,(Value *)&local_588);
      Json::Value::~Value((Value *)&local_588);
      pCVar48 = pCVar48 + 1;
    } while (pCVar48 != pCVar63);
  }
  bVar19 = Json::Value::empty((Value *)&local_698);
  if (!bVar19) {
    Json::Value::Value(&local_260,(Value *)&local_698);
    pVVar24 = Json::Value::operator[](local_660,"compileGroups");
    Json::Value::operator=(pVVar24,&local_260);
    Json::Value::~Value(&local_260);
  }
  Json::Value::~Value((Value *)&local_698);
  Json::Value::~Value((Value *)local_520);
  Json::Value::~Value((Value *)&local_658);
  Json::Value::Value(&local_3a0,nullValue);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->Backtraces).CommandMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->Backtraces).FileMap._M_h);
  std::
  _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->Backtraces).NodeMap._M_h);
  Json::Value::Value((Value *)&local_618,&(this->Backtraces).Commands);
  pVVar24 = Json::Value::operator[](&local_3a0,"commands");
  Json::Value::operator=(pVVar24,(Value *)&local_618);
  Json::Value::~Value((Value *)&local_618);
  Json::Value::Value((Value *)&local_588,&(this->Backtraces).Files);
  pVVar24 = Json::Value::operator[](&local_3a0,"files");
  Json::Value::operator=(pVVar24,(Value *)&local_588);
  Json::Value::~Value((Value *)&local_588);
  Json::Value::Value((Value *)&local_698,&(this->Backtraces).Nodes);
  pVVar24 = Json::Value::operator[](&local_3a0,"nodes");
  Json::Value::operator=(pVVar24,(Value *)&local_698);
  Json::Value::~Value((Value *)&local_698);
  pVVar24 = Json::Value::operator[](local_660,"backtraceGraph");
  Json::Value::operator=(pVVar24,&local_3a0);
  Json::Value::~Value(&local_3a0);
  Json::Value::~Value(&local_328);
  return local_660;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}